

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_dialer_start(nng_dialer did,int flags)

{
  int iVar1;
  nni_dialer *local_20;
  nni_dialer *d;
  
  iVar1 = nni_dialer_find(&local_20,did.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_start(local_20,flags);
    nni_dialer_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_dialer_start(nng_dialer did, int flags)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, did.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_start(d, flags);
	nni_dialer_rele(d);
	return (rv);
}